

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPruning.cpp
# Opt level: O2

bool AlphaVectorPruning::LexGreater(AlphaVector *alpha1,AlphaVector *alpha2)

{
  bool bVar1;
  byte in_CL;
  Index i;
  Index i_00;
  Index IVar2;
  double dVar3;
  double dVar4;
  
  i_00 = 0;
  do {
    IVar2 = (Index)((ulong)((long)(alpha1->_m_values).
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)(alpha1->_m_values).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start) >> 3);
    if (i_00 == IVar2) {
LAB_0041b1cd:
      return (bool)(i_00 != IVar2 & in_CL);
    }
    dVar3 = AlphaVector::GetValue(alpha1,i_00);
    dVar4 = AlphaVector::GetValue(alpha2,i_00);
    bVar1 = Globals::EqualReward(dVar3,dVar4);
    if (!bVar1) {
      dVar3 = AlphaVector::GetValue(alpha1,i_00);
      dVar4 = AlphaVector::GetValue(alpha2,i_00);
      in_CL = dVar4 < dVar3;
      goto LAB_0041b1cd;
    }
    i_00 = i_00 + 1;
  } while( true );
}

Assistant:

bool AlphaVectorPruning::LexGreater(const AlphaVector &alpha1,
                                    const AlphaVector &alpha2)
{
    for(Index i=0;i!=alpha1.GetNrValues();++i)
    {
        if(Globals::EqualReward(alpha1.GetValue(i),
                                alpha2.GetValue(i)))
            continue;
        else if(alpha1.GetValue(i)>alpha2.GetValue(i))
            return(true);
        else
            return(false);
    }
    return(false);
}